

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-emfile.c
# Opt level: O2

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *stream;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  uv_buf_t uVar6;
  size_t sStack_10040;
  uv_buf_t send_bufs [4096];
  
  stream = connect_req.handle;
  if (req == &connect_req) {
    if (status == 0) {
      connect_cb_called = connect_cb_called + 1;
      lVar4 = 0;
      do {
        if (lVar4 == 3) {
          sStack_10040 = 0x163551;
          iVar1 = uv_shutdown(&shutdown_req,stream,shutdown_cb);
          if (iVar1 == 0) {
            sStack_10040 = 0x16356b;
            iVar1 = uv_read_start(stream,alloc_cb,read_cb);
            if (iVar1 == 0) {
              return;
            }
            pcVar3 = "r == 0";
            sVar2 = 0x8f;
          }
          else {
            pcVar3 = "r == 0";
            sVar2 = 0x8b;
          }
          goto LAB_0016352f;
        }
        for (lVar5 = 8; lVar5 != 0x10008; lVar5 = lVar5 + 0x10) {
          sStack_10040 = 0x1634cd;
          uVar6 = uv_buf_init(send_buffer + bytes_sent,0x2728);
          *(char **)((long)send_bufs + lVar5 + -8) = uVar6.base;
          *(size_t *)((long)&send_bufs[0].base + lVar5) = uVar6.len;
          bytes_sent = bytes_sent + 0x2728;
        }
        sStack_10040 = 0x163504;
        iVar1 = uv_write(write_reqs + lVar4,stream,send_bufs,0x1000,write_cb);
        lVar4 = lVar4 + 1;
      } while (iVar1 == 0);
      pcVar3 = "r == 0";
      sVar2 = 0x86;
    }
    else {
      pcVar3 = "status == 0";
      sStack_10040 = 0x77;
      sVar2 = sStack_10040;
    }
  }
  else {
    pcVar3 = "req == &connect_req";
    sStack_10040 = 0x76;
    sVar2 = sStack_10040;
  }
LAB_0016352f:
  sStack_10040 = 0x163536;
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-writealot.c"
          ,sVar2,pcVar3);
  sStack_10040 = 0x16353b;
  abort();
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  /* |status| should equal 0 because the connection should have been accepted,
   * it's just that the server immediately closes it again.
   */
  ASSERT(0 == status);
  connect_cb_called += 1;
  uv_close((uv_handle_t*) &server_handle, NULL);
  uv_close((uv_handle_t*) &client_handle, NULL);
}